

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_profile_start(lua_State *L)

{
  GCtab *pGVar1;
  GCtab *pGVar2;
  GCRef *local_140;
  cTValue local_120;
  TValue key;
  lua_State *L2;
  GCfunc *func;
  GCstr *mode;
  GCtab *registry;
  lua_State *L_local;
  TValue *local_e8;
  GCtab *local_e0;
  undefined4 local_d4;
  TValue local_d0;
  TValue *local_c8;
  GCtab *local_c0;
  undefined4 local_b4;
  TValue local_b0;
  TValue *local_a8;
  char *local_a0;
  TValue *local_98;
  GCtab *local_90;
  lua_State *local_88;
  TValue *local_80;
  GCtab *local_78;
  undefined4 local_6c;
  lua_State *local_68;
  TValue *local_60;
  GCtab *local_58;
  undefined4 local_4c;
  lua_State *local_48;
  TValue *local_40;
  char *local_38;
  TValue *local_30;
  GCtab *local_28;
  GCstr *local_20;
  GCobj *o;
  uint64_t local_10;
  
  mode = (GCstr *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff);
  registry = (GCtab *)L;
  func = (GCfunc *)lj_lib_optstr(L,1);
  L2 = (lua_State *)lj_lib_checkfunc((lua_State *)registry,2);
  key = (TValue)lua_newthread((lua_State *)registry);
  pGVar1 = registry;
  local_120.n = -5.73116149175846e-322;
  local_e8 = lj_tab_set((lua_State *)registry,(GCtab *)mode,&local_120);
  pGVar2 = registry;
  local_e0 = pGVar1;
  L_local = (lua_State *)key;
  local_c0 = pGVar1;
  local_d0 = key;
  local_d4 = 0xfffffff9;
  local_b0 = key;
  local_b4 = 0xfffffff9;
  local_e8->u64 = key.u64 | 0xfffc800000000000;
  local_90 = pGVar1;
  local_a0 = "store to dead GC object";
  local_120.n = -5.03946958758071e-322;
  local_c8 = local_e8;
  local_a8 = local_e8;
  local_98 = local_e8;
  local_80 = lj_tab_set((lua_State *)registry,(GCtab *)mode,&local_120);
  local_78 = pGVar2;
  local_88 = L2;
  local_58 = pGVar2;
  local_68 = L2;
  local_6c = 0xfffffff7;
  local_48 = L2;
  local_4c = 0xfffffff7;
  local_80->u64 = (ulong)L2 | 0xfffb800000000000;
  local_28 = pGVar2;
  local_38 = "store to dead GC object";
  if ((mode->marked & 4) != 0) {
    local_10 = (registry->array).ptr64;
    o = (GCobj *)mode;
    local_20 = mode;
    mode->marked = mode->marked & 0xfb;
    mode[1].nextgc.gcptr64 = *(uint64_t *)(local_10 + 0x40);
    *(GCstr **)(local_10 + 0x40) = mode;
  }
  if (func == (GCfunc *)0x0) {
    local_140 = (GCRef *)0x1c36d1;
  }
  else {
    local_140 = &(func->c).gclist;
  }
  local_60 = local_80;
  local_40 = local_80;
  local_30 = local_80;
  luaJIT_profile_start((lua_State *)registry,(char *)local_140,jit_profile_callback,(void *)key);
  return 0;
}

Assistant:

LJLIB_CF(jit_profile_start)
{
  GCtab *registry = tabV(registry(L));
  GCstr *mode = lj_lib_optstr(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  lua_State *L2 = lua_newthread(L);  /* Thread that runs profiler callback. */
  TValue key;
  /* Anchor thread and function in registry. */
  key.u64 = KEY_PROFILE_THREAD;
  setthreadV(L, lj_tab_set(L, registry, &key), L2);
  key.u64 = KEY_PROFILE_FUNC;
  setfuncV(L, lj_tab_set(L, registry, &key), func);
  lj_gc_anybarriert(L, registry);
  luaJIT_profile_start(L, mode ? strdata(mode) : "",
		       (luaJIT_profile_callback)jit_profile_callback, L2);
  return 0;
}